

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::is_builtin_type(Compiler *this,SPIRType *type)

{
  char cVar1;
  size_t sVar2;
  Meta *pMVar3;
  long lVar4;
  bool bVar5;
  
  pMVar3 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if ((pMVar3 != (Meta *)0x0) &&
     (sVar2 = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size,
     sVar2 != 0)) {
    lVar4 = 0;
    do {
      cVar1 = *(char *)((long)(((pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.
                               ptr)->extended).values + lVar4 + -0x44);
      if (cVar1 != '\0') {
        return (bool)cVar1;
      }
      bVar5 = sVar2 * 0x188 + -0x188 != lVar4;
      lVar4 = lVar4 + 0x188;
    } while (bVar5);
  }
  return false;
}

Assistant:

bool Compiler::is_builtin_type(const SPIRType &type) const
{
	auto *type_meta = ir.find_meta(type.self);

	// We can have builtin structs as well. If one member of a struct is builtin, the struct must also be builtin.
	if (type_meta)
		for (auto &m : type_meta->members)
			if (m.builtin)
				return true;

	return false;
}